

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserBase.h
# Opt level: O0

void __thiscall slang::parsing::ParserBase::Window::Window(Window *this,Preprocessor *source)

{
  long lVar1;
  Token *pTVar2;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  Token *in_stack_ffffffffffffffb0;
  Token *this_00;
  Token *local_48;
  
  *in_RDI = in_RSI;
  in_RDI[1] = 0;
  Token::Token(in_stack_ffffffffffffffb0);
  Token::Token(in_stack_ffffffffffffffb0);
  in_RDI[6] = 0;
  in_RDI[7] = 0;
  in_RDI[8] = 0;
  in_RDI[8] = 0x20;
  lVar1 = in_RDI[8];
  pTVar2 = (Token *)operator_new__(0x8e2443);
  if (lVar1 != 0) {
    this_00 = pTVar2 + lVar1;
    local_48 = pTVar2;
    do {
      Token::Token(this_00);
      local_48 = local_48 + 1;
    } while (local_48 != this_00);
  }
  in_RDI[1] = pTVar2;
  return;
}

Assistant:

explicit Window(Preprocessor& source) : tokenSource(source) {
            capacity = 32;
            buffer = new Token[capacity];
        }